

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

void __thiscall cornerstone::raft_server::invite_srv_to_join_cluster(raft_server *this)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  element_type *req_00;
  element_type *this_00;
  cluster_config *in_RDI;
  ptr<req_msg> req;
  value_type *__x;
  _List_node_base **this_01;
  unsigned_long *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff60;
  msg_type *args_1;
  unsigned_long *in_stack_ffffffffffffff90;
  unsigned_long *in_stack_ffffffffffffff98;
  rpc_handler *in_stack_ffffffffffffffc0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  unsigned_long local_18 [2];
  cluster_config *this_03;
  
  this_03 = in_RDI;
  peVar2 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d9cb8);
  srv_state::get_term(peVar2);
  args_1 = (msg_type *)((long)&in_RDI->prev_log_idx_ + 4);
  std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1d9cf0);
  peer::get_id((peer *)0x1d9cf8);
  this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = std::
           __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d9d1c);
  iVar1 = (*peVar3->_vptr_log_store[2])();
  req_00 = (element_type *)(CONCAT44(extraout_var,iVar1) + -1);
  this_01 = &(in_RDI->servers_).
             super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
  __x = (value_type *)&stack0xffffffffffffffc8;
  cs_new<cornerstone::req_msg,unsigned_long,cornerstone::msg_type,int&,int,long,unsigned_long,unsigned_long&>
            (local_18,args_1,(int *)in_RDI,in_stack_ffffffffffffff60,
             (long *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  this_00 = std::__shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d9d8f);
  req_msg::log_entries(this_00);
  peVar2 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d9daf);
  srv_state::get_term(peVar2);
  std::__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1d9dd9);
  cluster_config::serialize(this_03);
  cs_new<cornerstone::log_entry,unsigned_long,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,cornerstone::log_val_type>
            (in_stack_ffffffffffffff58,
             (unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)this_01,
             (log_val_type *)__x);
  std::
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  ::push_back((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               *)this_01,__x);
  std::shared_ptr<cornerstone::log_entry>::~shared_ptr
            ((shared_ptr<cornerstone::log_entry> *)0x1d9e26);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)this_01);
  std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1d9e41);
  peer::send_req((peer *)this_02._M_pi,(ptr<req_msg> *)req_00,in_stack_ffffffffffffffc0);
  std::shared_ptr<cornerstone::req_msg>::~shared_ptr((shared_ptr<cornerstone::req_msg> *)0x1d9e6c);
  return;
}

Assistant:

void raft_server::invite_srv_to_join_cluster()
{
    ptr<req_msg> req(cs_new<req_msg>(
        state_->get_term(),
        msg_type::join_cluster_request,
        id_,
        srv_to_join_->get_id(),
        0L,
        log_store_->next_slot() - 1,
        quick_commit_idx_));
    req->log_entries().push_back(cs_new<log_entry>(state_->get_term(), config_->serialize(), log_val_type::conf));
    srv_to_join_->send_req(req, ex_resp_handler_);
}